

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTester_1000_1999.cpp
# Opt level: O0

void __thiscall psy::C::ParserTester::case1055(ParserTester *this)

{
  initializer_list<psy::C::SyntaxKind> __l;
  Expectation *pEVar1;
  allocator<psy::C::SyntaxKind> local_1e3;
  SyntaxKind local_1e2;
  iterator local_1e0;
  size_type local_1d8;
  vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> local_1d0;
  Expectation local_1b8;
  Expectation local_100;
  allocator<char> local_31;
  string local_30;
  ParserTester *local_10;
  ParserTester *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"u\'x\'",&local_31);
  Expectation::Expectation(&local_1b8);
  local_1e2 = CharacterConstantExpression;
  local_1e0 = &local_1e2;
  local_1d8 = 1;
  std::allocator<psy::C::SyntaxKind>::allocator(&local_1e3);
  __l._M_len = local_1d8;
  __l._M_array = local_1e0;
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::vector
            (&local_1d0,__l,&local_1e3);
  pEVar1 = Expectation::AST(&local_1b8,&local_1d0);
  Expectation::Expectation(&local_100,pEVar1);
  parseExpression(this,&local_30,&local_100);
  Expectation::~Expectation(&local_100);
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::~vector(&local_1d0);
  std::allocator<psy::C::SyntaxKind>::~allocator(&local_1e3);
  Expectation::~Expectation(&local_1b8);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

void ParserTester::case1055()
{
    parseExpression("u'x'",
                    Expectation().AST( { SyntaxKind::CharacterConstantExpression }));
}